

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O3

int StartExpressScanRequestRPLIDAR(RPLIDAR *pRPLIDAR)

{
  HANDLE pvVar1;
  int iVar2;
  ssize_t sVar3;
  int iVar4;
  HANDLE pvVar5;
  uint uVar6;
  int DataType;
  int SendMode;
  int DataResponseLength;
  uchar reqbuf [9];
  fd_set sock_set;
  int local_c4;
  int local_c0;
  int local_bc;
  undefined8 local_b8;
  undefined1 local_b0;
  timeval local_a8;
  fd_set local_98;
  
  local_b0 = 0x22;
  local_b8 = 0x582a5;
  uVar6 = 0;
  local_bc = 0;
  local_c0 = 0;
  local_c4 = 0;
  iVar2 = (pRPLIDAR->RS232Port).DevType;
  if (iVar2 - 1U < 4) {
    iVar2 = (pRPLIDAR->RS232Port).s;
    do {
      sVar3 = send(iVar2,(void *)((long)&local_b8 + (ulong)uVar6),(ulong)(9 - uVar6),0);
      if ((int)sVar3 < 1) goto LAB_00123133;
      uVar6 = uVar6 + (int)sVar3;
    } while ((int)uVar6 < 9);
  }
  else {
    if (iVar2 != 0) {
LAB_00123133:
      puts("Error writing data to a RPLIDAR. ");
      return 1;
    }
    iVar2 = *(int *)&(pRPLIDAR->RS232Port).hDev;
    uVar6 = 0;
    do {
      sVar3 = write(iVar2,(void *)((long)&local_b8 + (ulong)uVar6),(ulong)(9 - uVar6));
      if ((int)sVar3 < 1) goto LAB_00123133;
      uVar6 = uVar6 + (int)sVar3;
    } while (uVar6 < 9);
  }
  iVar2 = GetResponseDescriptorRPLIDAR(pRPLIDAR,&local_bc,&local_c0,&local_c4);
  if (iVar2 != 0) {
    return 1;
  }
  if (((local_bc != 0x54) || (local_c0 != 1)) || (local_c4 != 0x82)) {
    puts(
        "A RPLIDAR is not responding correctly : Unhandled response descriptor, please try another scan mode. "
        );
    return 0x11;
  }
  iVar2 = (pRPLIDAR->RS232Port).DevType;
  if (iVar2 - 1U < 4) {
    iVar2 = (pRPLIDAR->RS232Port).s;
    local_98.fds_bits[0xe] = 0;
    local_98.fds_bits[0xf] = 0;
    local_98.fds_bits[0xc] = 0;
    local_98.fds_bits[0xd] = 0;
    local_98.fds_bits[10] = 0;
    local_98.fds_bits[0xb] = 0;
    local_98.fds_bits[8] = 0;
    local_98.fds_bits[9] = 0;
    local_98.fds_bits[6] = 0;
    local_98.fds_bits[7] = 0;
    local_98.fds_bits[4] = 0;
    local_98.fds_bits[5] = 0;
    iVar4 = iVar2 + 0x3f;
    if (-1 < iVar2) {
      iVar4 = iVar2;
    }
    local_98.fds_bits[2] = 0;
    local_98.fds_bits[3] = 0;
    local_98.fds_bits[0] = 0;
    local_98.fds_bits[1] = 0;
    local_98.fds_bits[iVar4 >> 6] = local_98.fds_bits[iVar4 >> 6] | 1L << ((byte)iVar2 & 0x3f);
  }
  else {
    if (iVar2 != 0) goto LAB_001231e5;
    pvVar1 = (pRPLIDAR->RS232Port).hDev;
    local_98.fds_bits[0] = 0;
    local_98.fds_bits[1] = 0;
    local_98.fds_bits[2] = 0;
    local_98.fds_bits[3] = 0;
    local_98.fds_bits[4] = 0;
    local_98.fds_bits[5] = 0;
    local_98.fds_bits[6] = 0;
    local_98.fds_bits[7] = 0;
    local_98.fds_bits[8] = 0;
    local_98.fds_bits[9] = 0;
    local_98.fds_bits[10] = 0;
    local_98.fds_bits[0xb] = 0;
    local_98.fds_bits[0xc] = 0;
    local_98.fds_bits[0xd] = 0;
    local_98.fds_bits[0xe] = 0;
    local_98.fds_bits[0xf] = 0;
    pvVar5 = (HANDLE)((long)pvVar1 + 0x3f);
    if (-1 < (long)pvVar1) {
      pvVar5 = pvVar1;
    }
    local_98.fds_bits[(long)pvVar5 >> 6] =
         local_98.fds_bits[(long)pvVar5 >> 6] | 1L << ((byte)pvVar1 & 0x3f);
    iVar2 = (int)pvVar1;
  }
  local_a8.tv_usec = 500000;
  local_a8.tv_sec = 1;
  iVar2 = select(iVar2 + 1,&local_98,(fd_set *)0x0,(fd_set *)0x0,&local_a8);
  if ((iVar2 != -1) && (iVar2 != 0)) {
    pRPLIDAR->esdata_prev[0x40] = '\0';
    pRPLIDAR->esdata_prev[0x41] = '\0';
    pRPLIDAR->esdata_prev[0x42] = '\0';
    pRPLIDAR->esdata_prev[0x43] = '\0';
    pRPLIDAR->esdata_prev[0x44] = '\0';
    pRPLIDAR->esdata_prev[0x45] = '\0';
    pRPLIDAR->esdata_prev[0x46] = '\0';
    pRPLIDAR->esdata_prev[0x47] = '\0';
    pRPLIDAR->esdata_prev[0x48] = '\0';
    pRPLIDAR->esdata_prev[0x49] = '\0';
    pRPLIDAR->esdata_prev[0x4a] = '\0';
    pRPLIDAR->esdata_prev[0x4b] = '\0';
    pRPLIDAR->esdata_prev[0x4c] = '\0';
    pRPLIDAR->esdata_prev[0x4d] = '\0';
    pRPLIDAR->esdata_prev[0x4e] = '\0';
    pRPLIDAR->esdata_prev[0x4f] = '\0';
    pRPLIDAR->esdata_prev[0x30] = '\0';
    pRPLIDAR->esdata_prev[0x31] = '\0';
    pRPLIDAR->esdata_prev[0x32] = '\0';
    pRPLIDAR->esdata_prev[0x33] = '\0';
    pRPLIDAR->esdata_prev[0x34] = '\0';
    pRPLIDAR->esdata_prev[0x35] = '\0';
    pRPLIDAR->esdata_prev[0x36] = '\0';
    pRPLIDAR->esdata_prev[0x37] = '\0';
    pRPLIDAR->esdata_prev[0x38] = '\0';
    pRPLIDAR->esdata_prev[0x39] = '\0';
    pRPLIDAR->esdata_prev[0x3a] = '\0';
    pRPLIDAR->esdata_prev[0x3b] = '\0';
    pRPLIDAR->esdata_prev[0x3c] = '\0';
    pRPLIDAR->esdata_prev[0x3d] = '\0';
    pRPLIDAR->esdata_prev[0x3e] = '\0';
    pRPLIDAR->esdata_prev[0x3f] = '\0';
    pRPLIDAR->esdata_prev[0x20] = '\0';
    pRPLIDAR->esdata_prev[0x21] = '\0';
    pRPLIDAR->esdata_prev[0x22] = '\0';
    pRPLIDAR->esdata_prev[0x23] = '\0';
    pRPLIDAR->esdata_prev[0x24] = '\0';
    pRPLIDAR->esdata_prev[0x25] = '\0';
    pRPLIDAR->esdata_prev[0x26] = '\0';
    pRPLIDAR->esdata_prev[0x27] = '\0';
    pRPLIDAR->esdata_prev[0x28] = '\0';
    pRPLIDAR->esdata_prev[0x29] = '\0';
    pRPLIDAR->esdata_prev[0x2a] = '\0';
    pRPLIDAR->esdata_prev[0x2b] = '\0';
    pRPLIDAR->esdata_prev[0x2c] = '\0';
    pRPLIDAR->esdata_prev[0x2d] = '\0';
    pRPLIDAR->esdata_prev[0x2e] = '\0';
    pRPLIDAR->esdata_prev[0x2f] = '\0';
    pRPLIDAR->esdata_prev[0x10] = '\0';
    pRPLIDAR->esdata_prev[0x11] = '\0';
    pRPLIDAR->esdata_prev[0x12] = '\0';
    pRPLIDAR->esdata_prev[0x13] = '\0';
    pRPLIDAR->esdata_prev[0x14] = '\0';
    pRPLIDAR->esdata_prev[0x15] = '\0';
    pRPLIDAR->esdata_prev[0x16] = '\0';
    pRPLIDAR->esdata_prev[0x17] = '\0';
    pRPLIDAR->esdata_prev[0x18] = '\0';
    pRPLIDAR->esdata_prev[0x19] = '\0';
    pRPLIDAR->esdata_prev[0x1a] = '\0';
    pRPLIDAR->esdata_prev[0x1b] = '\0';
    pRPLIDAR->esdata_prev[0x1c] = '\0';
    pRPLIDAR->esdata_prev[0x1d] = '\0';
    pRPLIDAR->esdata_prev[0x1e] = '\0';
    pRPLIDAR->esdata_prev[0x1f] = '\0';
    pRPLIDAR->esdata_prev[0] = '\0';
    pRPLIDAR->esdata_prev[1] = '\0';
    pRPLIDAR->esdata_prev[2] = '\0';
    pRPLIDAR->esdata_prev[3] = '\0';
    pRPLIDAR->esdata_prev[4] = '\0';
    pRPLIDAR->esdata_prev[5] = '\0';
    pRPLIDAR->esdata_prev[6] = '\0';
    pRPLIDAR->esdata_prev[7] = '\0';
    pRPLIDAR->esdata_prev[8] = '\0';
    pRPLIDAR->esdata_prev[9] = '\0';
    pRPLIDAR->esdata_prev[10] = '\0';
    pRPLIDAR->esdata_prev[0xb] = '\0';
    pRPLIDAR->esdata_prev[0xc] = '\0';
    pRPLIDAR->esdata_prev[0xd] = '\0';
    pRPLIDAR->esdata_prev[0xe] = '\0';
    pRPLIDAR->esdata_prev[0xf] = '\0';
    pRPLIDAR->esdata_prev[0x50] = '\0';
    pRPLIDAR->esdata_prev[0x51] = '\0';
    pRPLIDAR->esdata_prev[0x52] = '\0';
    pRPLIDAR->esdata_prev[0x53] = '\0';
    iVar2 = GetRawExpressScanDataResponseRPLIDAR(pRPLIDAR,pRPLIDAR->esdata_prev,0x54);
    return (uint)(iVar2 != 0);
  }
LAB_001231e5:
  puts("A RPLIDAR is not responding correctly. ");
  return 1;
}

Assistant:

inline int StartExpressScanRequestRPLIDAR(RPLIDAR* pRPLIDAR)
{
#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
	//unsigned short scanMode = 0;

	//if (SL_IS_FAIL(pRPLIDAR->drv->getTypicalScanMode(scanMode)))
	//{
	//	printf("A RPLIDAR is not responding correctly : getTypicalScanMode() failed. \n");
	//	return EXIT_FAILURE;
	//}
	if (SL_IS_FAIL(pRPLIDAR->drv->startScanExpress(false, SL_LIDAR_CONF_SCAN_COMMAND_EXPRESS)))
	{
		printf("A RPLIDAR is not responding correctly : startScanExpress() failed. \n");
		return EXIT_FAILURE;
	}
	pRPLIDAR->nodes_cache->clear();
#else
	unsigned char reqbuf[] = {START_FLAG1_RPLIDAR,EXPRESS_SCAN_REQUEST_RPLIDAR,0x05,0,0,0,0,0,0x22};
	int DataResponseLength = 0, SendMode = 0, DataType = 0;

	// Send request.
	if (WriteAllRS232Port(&pRPLIDAR->RS232Port, reqbuf, sizeof(reqbuf)) != EXIT_SUCCESS)
	{
		printf("Error writing data to a RPLIDAR. \n");
		return EXIT_FAILURE;
	}

	// Receive the response descriptor.
	if (GetResponseDescriptorRPLIDAR(pRPLIDAR, &DataResponseLength, &SendMode, &DataType) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	// Quick check of the response descriptor.
	if ((DataResponseLength != NB_BYTES_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR)||
		(SendMode != SINGLE_REQUEST_MULTIPLE_RESPONSE_SEND_MODE_RPLIDAR)||
		(DataType != MEASUREMENT_CAPSULED_RESPONSE_RPLIDAR))
	{ 
		printf("A RPLIDAR is not responding correctly : Unhandled response descriptor, please try another scan mode. \n");
		return EXIT_NOT_IMPLEMENTED;	
	}

	// The first data response might take some time to come, see https://github.com/ENSTABretagneRobotics/Hardware-MATLAB/issues/2...
	if (WaitForRS232Port(&pRPLIDAR->RS232Port, 1500, 5) != EXIT_SUCCESS)
	{
		printf("A RPLIDAR is not responding correctly. \n");
		return EXIT_FAILURE;
	}

	// Receive the first data response (2 data responses needed for angles computation...).
	memset(pRPLIDAR->esdata_prev, 0, sizeof(pRPLIDAR->esdata_prev));
	if (GetRawExpressScanDataResponseRPLIDAR(pRPLIDAR, pRPLIDAR->esdata_prev, NB_BYTES_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
#endif // ENABLE_RPLIDAR_SDK_SUPPORT

	return EXIT_SUCCESS;
}